

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zoombox.c
# Opt level: O3

void zoombox(tgestate_t *state)

{
  uint uVar1;
  zxspectrum_t *pzVar2;
  uint uVar3;
  attribute_t aVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  uint8_t uVar12;
  uint8_t *puVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint8_t uVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  int local_48;
  
  (state->zoombox).x = '\f';
  (state->zoombox).y = '\b';
  aVar4 = choose_game_window_attributes(state);
  (state->speccy->screen).attributes[(long)state->width * 9 + 0x12] = aVar4;
  (state->speccy->screen).attributes[(long)state->width * 9 + 0x13] = aVar4;
  (state->speccy->screen).attributes[(long)state->width * 10 + 0x12] = aVar4;
  (state->speccy->screen).attributes[(long)state->width * 10 + 0x13] = aVar4;
  (state->zoombox).width = '\0';
  (state->zoombox).height = '\0';
  do {
    (*state->speccy->stamp)(state->speccy);
    uVar12 = (state->zoombox).x;
    bVar5 = (state->zoombox).width;
    bVar9 = 1;
    if (uVar12 != '\x01') {
      bVar9 = uVar12 - 1;
      (state->zoombox).x = bVar9;
      bVar5 = bVar5 + 1;
      (state->zoombox).width = bVar5;
    }
    if ((byte)(bVar5 + bVar9) < 0x16) {
      bVar5 = bVar5 + 1;
      (state->zoombox).width = bVar5;
    }
    uVar12 = (state->zoombox).y;
    uVar17 = (state->zoombox).height;
    bVar11 = 1;
    if (uVar12 != '\x01') {
      bVar11 = uVar12 - 1;
      (state->zoombox).y = bVar11;
      uVar17 = uVar17 + '\x01';
      (state->zoombox).height = uVar17;
    }
    if ((byte)(uVar17 + bVar11) < 0xf) {
      uVar17 = uVar17 + '\x01';
      (state->zoombox).height = uVar17;
    }
    local_48 = (int)state->speccy + 0x30;
    puVar18 = state->window_buf +
              (ulong)((int)state->window_buf_stride * (uint)bVar11 + (uint)bVar9 & 0xffff) + 1;
    puVar19 = (state->speccy->screen).pixels +
              (ulong)bVar9 + (ulong)game_window_start_offsets[(ulong)bVar11 * 8];
    iVar6 = state->columns;
    do {
      cVar10 = -8;
      puVar13 = puVar19;
      do {
        uVar8 = (ulong)(state->zoombox).width;
        memcpy(puVar13,puVar18,uVar8);
        puVar18 = puVar18 + uVar8 + (byte)((char)iVar6 - bVar5);
        uVar1 = state->width;
        puVar13 = puVar13 + (long)(int)uVar1 * 8 + (uVar8 - bVar5);
        cVar10 = cVar10 + '\x01';
      } while (cVar10 != '\0');
      uVar3 = uVar1 + 0x700;
      if ((~((int)puVar19 - local_48) & 0xe0U) != 0) {
        uVar3 = uVar1;
      }
      puVar19 = puVar19 + ((ulong)uVar3 & 0xffff);
      uVar17 = uVar17 + 0xff;
    } while (uVar17 != '\0');
    pzVar2 = state->speccy;
    iVar6 = (int)pzVar2 + 0x30;
    lVar7 = (ulong)*(ushort *)("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) + 0x30;
    uVar8 = (ulong)(state->zoombox).x;
    puVar13 = (pzVar2->screen).pixels + uVar8 + lVar7 + -0x31;
    puVar18 = (pzVar2->screen).pixels + uVar8 + lVar7 + -0x30;
    puVar19 = (pzVar2->screen).pixels +
              *(ushort *)("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) + uVar8 +
              -0x30;
    lVar7 = 0x101 - (long)puVar19;
    lVar15 = 0;
    do {
      *puVar13 = (&zoombox_draw_tile_zoombox_tiles)[lVar15];
      puVar13 = puVar13 + 0x100;
      lVar15 = lVar15 + 1;
      lVar7 = lVar7 + -0x100;
    } while ((char)lVar15 != '\b');
    uVar8 = -(lVar7 + (long)state->speccy);
    lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
    if ((long)uVar8 < 0x800) {
      lVar7 = 0;
    }
    (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
    uVar12 = (state->zoombox).width;
    lVar7 = 0x100 - (long)puVar19;
    do {
      lVar15 = lVar7;
      lVar7 = 0;
      lVar16 = 0;
      do {
        puVar18[lVar7] = (&DAT_0010fa88)[lVar16];
        lVar16 = lVar16 + 1;
        lVar7 = lVar7 + 0x100;
      } while ((char)lVar16 != '\b');
      puVar18 = puVar18 + 1;
      uVar8 = (lVar7 - (long)state->speccy) - lVar15;
      lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
      if ((long)uVar8 < 0x800) {
        lVar7 = 0;
      }
      (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
      uVar12 = uVar12 + 0xff;
      lVar7 = lVar15 + -1;
    } while (uVar12 != '\0');
    lVar7 = 0;
    lVar16 = 0;
    do {
      puVar18[lVar7] = (&DAT_0010fa90)[lVar16];
      lVar16 = lVar16 + 1;
      lVar7 = lVar7 + 0x100;
    } while ((char)lVar16 != '\b');
    uVar8 = lVar7 - (long)((state->speccy->screen).pixels + lVar15 + -0x31);
    lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
    if ((long)uVar8 < 0x800) {
      lVar7 = 0;
    }
    (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
    iVar14 = state->width + 0x700;
    if ((~((int)puVar18 - iVar6) & 0xe0U) != 0) {
      iVar14 = state->width;
    }
    uVar12 = (state->zoombox).height;
    puVar18 = puVar18 + iVar14;
    do {
      puVar19 = puVar18;
      lVar7 = 0x130 - (long)puVar19;
      lVar15 = 0;
      puVar18 = puVar19;
      do {
        *puVar18 = (&DAT_0010fa98)[lVar15];
        puVar18 = puVar18 + 0x100;
        lVar15 = lVar15 + 1;
        lVar7 = lVar7 + -0x100;
      } while ((char)lVar15 != '\b');
      uVar8 = -(lVar7 + (long)state->speccy);
      lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
      if ((long)uVar8 < 0x800) {
        lVar7 = 0;
      }
      (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
      iVar14 = state->width + 0x700;
      if ((~((int)puVar19 - iVar6) & 0xe0U) != 0) {
        iVar14 = state->width;
      }
      puVar18 = puVar19 + iVar14;
      uVar12 = uVar12 + 0xff;
    } while (uVar12 != '\0');
    lVar7 = 0x130 - (long)(puVar19 + iVar14);
    lVar15 = 0;
    puVar13 = puVar18;
    do {
      *puVar13 = (&DAT_0010faa0)[lVar15];
      puVar13 = puVar13 + 0x100;
      lVar15 = lVar15 + 1;
      lVar7 = lVar7 + -0x100;
    } while ((char)lVar15 != '\b');
    puVar18 = puVar18 + -1;
    uVar8 = -(lVar7 + (long)state->speccy);
    lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
    if ((long)uVar8 < 0x800) {
      lVar7 = 0;
    }
    (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
    uVar12 = (state->zoombox).width;
    lVar7 = 0x131 - (long)(puVar19 + iVar14);
    do {
      lVar15 = lVar7;
      lVar7 = 0;
      lVar16 = 0;
      do {
        puVar18[lVar7] = (&DAT_0010fa88)[lVar16];
        lVar16 = lVar16 + 1;
        lVar7 = lVar7 + 0x100;
      } while ((char)lVar16 != '\b');
      puVar18 = puVar18 + -1;
      uVar8 = (lVar7 - (long)state->speccy) - lVar15;
      lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
      if ((long)uVar8 < 0x800) {
        lVar7 = 0;
      }
      (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
      uVar12 = uVar12 + 0xff;
      lVar7 = lVar15 + 1;
    } while (uVar12 != '\0');
    lVar7 = 0;
    lVar16 = 0;
    do {
      puVar18[lVar7] = (&DAT_0010faa8)[lVar16];
      lVar16 = lVar16 + 1;
      lVar7 = lVar7 + 0x100;
    } while ((char)lVar16 != '\b');
    uVar8 = lVar7 - (long)((state->speccy->screen).pixels + lVar15 + -0x2f);
    lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
    if ((long)uVar8 < 0x800) {
      lVar7 = 0;
    }
    (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
    iVar14 = 0;
    if (((int)puVar18 - iVar6 & 0xe0U) == 0) {
      iVar14 = -0x700;
    }
    puVar18 = puVar18 + (iVar14 - state->width);
    uVar12 = (state->zoombox).height;
    do {
      lVar7 = 0x130 - (long)puVar18;
      lVar15 = 0;
      puVar19 = puVar18;
      do {
        *puVar19 = (&DAT_0010fa98)[lVar15];
        puVar19 = puVar19 + 0x100;
        lVar15 = lVar15 + 1;
        lVar7 = lVar7 + -0x100;
      } while ((char)lVar15 != '\b');
      uVar8 = -(lVar7 + (long)state->speccy);
      lVar7 = (ulong)(0xfff < (long)uVar8) * 0x100 + 0x100;
      if ((long)uVar8 < 0x800) {
        lVar7 = 0;
      }
      (state->speccy->screen).attributes[lVar7 + (uVar8 & 0xff)] = state->game_window_attribute;
      iVar14 = 0;
      if (((int)puVar18 - iVar6 & 0xe0U) == 0) {
        iVar14 = -0x700;
      }
      puVar18 = puVar18 + (iVar14 - state->width);
      uVar12 = uVar12 + 0xff;
    } while (uVar12 != '\0');
    invalidate_bitmap(state,(state->speccy->screen).pixels +
                            (ulong)(state->zoombox).x +
                            (ulong)*(ushort *)
                                    ("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) +
                            -1,(uint)(state->zoombox).width * 8 + 0x10,
                      (uint)(state->zoombox).height * 8 + 0x10);
    (*state->speccy->sleep)
              (state->speccy,
               (((uint)(state->zoombox).width + (uint)(state->zoombox).height) * 0x1b167) / 0x23);
  } while ((uint)(state->zoombox).width + (uint)(state->zoombox).height < 0x23);
  return;
}

Assistant:

void zoombox(tgestate_t *state)
{
  attribute_t attrs; /* was A */
  uint8_t    *pvar;  /* was HL */
  uint8_t     var;   /* was A */

  assert(state != NULL);

  state->zoombox.x = 12;
  state->zoombox.y = 8;

  attrs = choose_game_window_attributes(state);

  state->speccy->screen.attributes[ 9 * state->width + 18] = attrs;
  state->speccy->screen.attributes[ 9 * state->width + 19] = attrs;
  state->speccy->screen.attributes[10 * state->width + 18] = attrs;
  state->speccy->screen.attributes[10 * state->width + 19] = attrs;

  state->zoombox.width  = 0;
  state->zoombox.height = 0;

  do
  {
    state->speccy->stamp(state->speccy);

    /* Shrink X and grow width until X is 1 */
    pvar = &state->zoombox.x;
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow width until it's 22 */
    pvar++; /* -> &state->width */
    var += *pvar;
    if (var < 22)
      (*pvar)++;

    /* Shrink Y and grow height until Y is 1 */
    pvar++; /* -> &state->zoombox.y */
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow height until it's 15 */
    pvar++; /* -> &state->height */
    var += *pvar;
    if (var < 15)
      (*pvar)++;

    zoombox_fill(state);
    zoombox_draw_border(state);

    /* Conv: Invalidation added over the original game. */
    invalidate_bitmap(state,
                      &state->speccy->screen.pixels[0] + game_window_start_offsets[(state->zoombox.y - 1) * 8] + state->zoombox.x - 1,
                      (state->zoombox.width + 2) * 8,
                      (state->zoombox.height + 2) * 8);

    {
      /* Conv: Timing: The original game slows in proportion to the size of
       * the area being zoomboxed. We simulate that here. */
      int delay = (state->zoombox.height + state->zoombox.width) * 110951 / 35;
      state->speccy->sleep(state->speccy, delay);
    }
  }
  while (state->zoombox.height + state->zoombox.width < 35);
}